

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md5.c
# Opt level: O0

CURLcode Curl_md5it(uchar *outbuffer,uchar *input,size_t len)

{
  uint len_00;
  undefined1 local_80 [8];
  my_md5_ctx ctx;
  CURLcode result;
  size_t len_local;
  uchar *input_local;
  uchar *outbuffer_local;
  
  unique0x10000071 = len;
  ctx.data[0xf] = my_md5_init((my_md5_ctx *)local_80);
  if (ctx.data[0xf] == CURLE_OK) {
    len_00 = curlx_uztoui(stack0xffffffffffffffe0);
    my_md5_update((my_md5_ctx *)local_80,input,len_00);
    my_md5_final(outbuffer,(my_md5_ctx *)local_80);
  }
  return ctx.data[0xf];
}

Assistant:

CURLcode Curl_md5it(unsigned char *outbuffer, const unsigned char *input,
                    const size_t len)
{
  CURLcode result;
  my_md5_ctx ctx;

  result = my_md5_init(&ctx);
  if(!result) {
    my_md5_update(&ctx, input, curlx_uztoui(len));
    my_md5_final(outbuffer, &ctx);
  }
  return result;
}